

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

uchar * EVP_PKEY_get0_siphash(EVP_PKEY *pkey,size_t *len)

{
  int iVar1;
  int *piVar2;
  EVP_PKEY *in_RSI;
  int *in_RDI;
  ASN1_OCTET_STRING *os;
  char *func;
  uchar *local_8;
  
  func = (char *)0x0;
  if (*in_RDI == 0x426) {
    piVar2 = (int *)evp_pkey_get_legacy(in_RSI);
    if (piVar2 == (int *)0x0) {
      local_8 = (uchar *)0x0;
    }
    else {
      iVar1 = *piVar2;
      in_RSI->type = (int)(long)iVar1;
      in_RSI->save_type = (int)((ulong)(long)iVar1 >> 0x20);
      local_8 = *(uchar **)(piVar2 + 2);
    }
  }
  else {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),func);
    ERR_set_error(6,0xaf,(char *)0x0);
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

const unsigned char *EVP_PKEY_get0_siphash(const EVP_PKEY *pkey, size_t *len)
{
    const ASN1_OCTET_STRING *os = NULL;

    if (pkey->type != EVP_PKEY_SIPHASH) {
        ERR_raise(ERR_LIB_EVP, EVP_R_EXPECTING_A_SIPHASH_KEY);
        return NULL;
    }
    os = evp_pkey_get_legacy((EVP_PKEY *)pkey);
    if (os != NULL) {
        *len = os->length;
        return os->data;
    }
    return NULL;
}